

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kmers.h
# Opt level: O3

void __thiscall Kmers<DNA>::ForEach(Kmers<DNA> *this,Callback *block)

{
  ulong uVar1;
  byte bVar2;
  size_t sVar3;
  size_type sVar4;
  size_type sVar5;
  byte bVar6;
  size_t sVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  pointer pcVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  unsigned_long local_40;
  uint local_34;
  
  sVar3 = this->mLength;
  pcVar11 = (this->mRef->sequence)._M_dataplus._M_p;
  if (sVar3 == 0) {
    uVar14 = 0;
  }
  else {
    bVar6 = 0;
    uVar14 = 0;
    sVar7 = 0;
    sVar9 = 0xffffffffffffffff;
    do {
      bVar2 = pcVar11[sVar7];
      sVar10 = sVar7;
      if (bVar2 < 0x54) {
        iVar8 = 0;
        if (bVar2 != 0x41) {
          if (bVar2 == 0x43) {
            iVar8 = 1;
          }
          else {
            if (bVar2 != 0x47) goto LAB_00149afc;
            iVar8 = 3;
          }
        }
LAB_00149af2:
        uVar14 = uVar14 | iVar8 << (bVar6 & 0x1e);
        sVar10 = sVar9;
      }
      else if (bVar2 - 0x54 < 2) {
        iVar8 = 2;
        goto LAB_00149af2;
      }
LAB_00149afc:
      sVar7 = sVar7 + 1;
      bVar6 = bVar6 + 2;
      sVar9 = sVar10;
    } while (sVar3 != sVar7);
    pcVar11 = pcVar11 + sVar3;
    if (sVar10 != 0xffffffffffffffff) {
      local_34 = 0xffffffff;
      local_40 = 0;
      if ((block->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*block->_M_invoker)((_Any_data *)block,&local_34,&local_40);
        goto LAB_00149b70;
      }
      goto LAB_00149c4e;
    }
  }
  local_40 = 0;
  local_34 = uVar14;
  if ((block->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*block->_M_invoker)((_Any_data *)block,&local_34,&local_40);
    sVar10 = 0xffffffffffffffff;
LAB_00149b70:
    sVar4 = (this->mRef->sequence)._M_string_length;
    sVar5 = this->mLength;
    if (sVar4 != sVar5) {
      uVar12 = 0;
      do {
        uVar14 = uVar14 >> 2;
        bVar6 = pcVar11[uVar12];
        if (bVar6 < 0x54) {
          iVar8 = 0;
          if (bVar6 != 0x41) {
            if (bVar6 == 0x43) {
              iVar8 = 1;
            }
            else {
              if (bVar6 != 0x47) goto LAB_00149c42;
              iVar8 = 3;
            }
          }
LAB_00149bdd:
          uVar14 = uVar14 | iVar8 << ((char)(int)this->mLength * '\x02' + 0x1eU & 0x1f);
        }
        else {
          if (bVar6 - 0x54 < 2) {
            iVar8 = 2;
            goto LAB_00149bdd;
          }
LAB_00149c42:
          sVar10 = this->mLength + uVar12;
        }
        uVar1 = uVar12 + 1;
        local_34 = uVar14;
        if (sVar10 != 0xffffffffffffffff && uVar1 <= sVar10) {
          local_34 = 0xffffffff;
        }
        local_40 = uVar1;
        if ((block->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00149c4e;
        (*block->_M_invoker)((_Any_data *)block,&local_34,&local_40);
        uVar13 = uVar12 + 2;
        uVar12 = uVar1;
      } while (uVar13 <= sVar4 - sVar5);
    }
    return;
  }
LAB_00149c4e:
  std::__throw_bad_function_call();
}

Assistant:

void ForEach( const Callback& block ) const {
    const char* ptr = mRef.sequence.data();

    auto bitIndex = []( const size_t pos ) {
      return ( pos * BitMapPolicy< Alphabet >::NumBits ) % ( sizeof( Kmer ) * 8 );
    };

    auto bitMapNucleotide = []( const char base ) {
      return BitMapPolicy< Alphabet >::BitMap( base );
    };

    // First kmer
    size_t lastAmbigIndex = ( size_t ) -1;
    Kmer   kmer           = 0;
    for( size_t k = 0; k < mLength; k++ ) {
      int8_t val = bitMapNucleotide( *ptr );
      if( val < 0 ) {
        lastAmbigIndex = k;
      } else {
        kmer |= ( val << bitIndex( k ) );
      }
      ptr++;
    }

    if( lastAmbigIndex == ( size_t ) -1 ) {
      block( kmer, 0 );
    } else {
      block( AmbiguousKmer, 0 );
    }

    // For each consecutive kmer, shift window by one
    size_t maxFrame = mRef.Length() - mLength;
    for( size_t frame = 1; frame <= maxFrame; frame++, ptr++ ) {
      kmer >>= BitMapPolicy< Alphabet >::NumBits;
      int8_t val = bitMapNucleotide( *ptr );
      if( val < 0 ) {
        lastAmbigIndex = frame + mLength - 1;
      } else {
        kmer |= ( val << bitIndex( mLength - 1 ) );
      }

      if( lastAmbigIndex == ( size_t ) -1 || frame > lastAmbigIndex ) {
        block( kmer, frame );
      } else {
        block( AmbiguousKmer, frame );
      }
    }
  }